

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<llbuild::buildsystem::BuildKey>::clear
          (SmallVectorImpl<llbuild::buildsystem::BuildKey> *this)

{
  long *plVar1;
  void *pvVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)(this->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
                 super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
                 super_SmallVectorBase.Size;
  if (uVar4 != 0) {
    pvVar2 = (this->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
             super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.
             super_SmallVectorBase.BeginX;
    lVar5 = uVar4 << 5;
    do {
      plVar1 = (long *)((long)pvVar2 + lVar5 + -0x10);
      plVar3 = *(long **)((long)pvVar2 + lVar5 + -0x20);
      if (plVar1 != plVar3) {
        operator_delete(plVar3,*plVar1 + 1);
      }
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != 0);
  }
  (this->super_SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>).
  super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>.super_SmallVectorBase.Size =
       0;
  return;
}

Assistant:

void clear() {
    this->destroy_range(this->begin(), this->end());
    this->Size = 0;
  }